

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O0

void (anonymous_namespace)::testExtendByBox<Imath_3_2::Vec4<short>>(char *type)

{
  bool bVar1;
  short sVar2;
  uint uVar3;
  uint uVar4;
  ostream *poVar5;
  ulong uVar6;
  size_type sVar7;
  reference v;
  short *psVar8;
  char *in_RDI;
  float fVar9;
  uint k_1;
  uint k;
  Vec4<short> p1_1;
  Vec4<short> p0_1;
  uint i_1;
  Vec4<short> max;
  Vec4<short> min;
  Box<Imath_3_2::Vec4<short>_> b_1;
  uint iters;
  Rand32 rand;
  Box<Imath_3_2::Vec4<short>_> b1;
  Box<Imath_3_2::Vec4<short>_> b0;
  Vec4<short> p1;
  Vec4<short> p0;
  uint j;
  uint i;
  vector<Imath_3_2::Vec4<short>,_std::allocator<Imath_3_2::Vec4<short>_>_> perms;
  Box<Imath_3_2::Vec4<short>_> b;
  float in_stack_fffffffffffffe78;
  float in_stack_fffffffffffffe7c;
  Box<Imath_3_2::Vec4<short>_> *in_stack_fffffffffffffe80;
  undefined6 in_stack_fffffffffffffe88;
  short in_stack_fffffffffffffe8e;
  Box<Imath_3_2::Vec4<short>_> *in_stack_fffffffffffffe90;
  undefined6 in_stack_fffffffffffffe98;
  short in_stack_fffffffffffffe9e;
  undefined4 in_stack_fffffffffffffea0;
  undefined2 in_stack_fffffffffffffea4;
  short in_stack_fffffffffffffea6;
  bool local_142;
  bool local_141;
  vector<Imath_3_2::Vec4<short>,_std::allocator<Imath_3_2::Vec4<short>_>_>
  *in_stack_fffffffffffffec0;
  bool local_111;
  uint local_100;
  uint local_fc;
  Vec4<short> local_f8;
  Vec4<short> local_f0;
  uint local_e8;
  Vec4<short> local_e4;
  Vec4<short> local_dc;
  Vec4<short> local_d4;
  Vec4<short> VStack_cc;
  undefined4 local_c4;
  Vec4<short> local_a4;
  Vec4<short> aVStack_9c [3];
  Vec4<short> local_84;
  Vec4<short> VStack_7c;
  Vec4<short> local_74;
  Vec4<short> local_6c;
  uint local_64;
  uint local_60;
  vector<Imath_3_2::Vec4<short>,_std::allocator<Imath_3_2::Vec4<short>_>_> local_50;
  Vec4<short> local_38;
  Vec4<short> local_30 [3];
  Vec4<short> local_18;
  Vec4<short> VStack_10;
  char *local_8;
  
  local_8 = in_RDI;
  poVar5 = std::operator<<((ostream *)&std::cout,"    extendBy() box for type ");
  poVar5 = std::operator<<(poVar5,local_8);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Box<Imath_3_2::Vec4<short>_>::Box(in_stack_fffffffffffffe80);
  Imath_3_2::Box<Imath_3_2::Vec4<short>_>::Box(in_stack_fffffffffffffe80);
  Imath_3_2::Box<Imath_3_2::Vec4<short>_>::extendBy
            ((Box<Imath_3_2::Vec4<short>_> *)
             CONCAT26(in_stack_fffffffffffffea6,
                      CONCAT24(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0)),
             (Box<Imath_3_2::Vec4<short>_> *)
             CONCAT26(in_stack_fffffffffffffe9e,in_stack_fffffffffffffe98));
  sVar2 = Imath_3_2::Vec4<short>::baseTypeMax();
  Imath_3_2::Vec4<short>::Vec4(local_30,sVar2);
  bVar1 = Imath_3_2::Vec4<short>::operator==(&local_18,local_30);
  local_111 = false;
  if (bVar1) {
    sVar2 = Imath_3_2::Vec4<short>::baseTypeLowest();
    Imath_3_2::Vec4<short>::Vec4(&local_38,sVar2);
    local_111 = Imath_3_2::Vec4<short>::operator==(&VStack_10,&local_38);
  }
  if (local_111 == false) {
    __assert_fail("b.min == T (T::baseTypeMax ()) && b.max == T (T::baseTypeLowest ())",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,300,
                  "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec4<short>]"
                 );
  }
  std::vector<Imath_3_2::Vec4<short>,_std::allocator<Imath_3_2::Vec4<short>_>_>::vector
            ((vector<Imath_3_2::Vec4<short>,_std::allocator<Imath_3_2::Vec4<short>_>_> *)0x1174bc);
  permutations<Imath_3_2::Vec4<short>>(in_stack_fffffffffffffec0);
  local_60 = 0;
  do {
    uVar6 = (ulong)local_60;
    sVar7 = std::vector<Imath_3_2::Vec4<short>,_std::allocator<Imath_3_2::Vec4<short>_>_>::size
                      (&local_50);
    if (sVar7 <= uVar6) {
      std::vector<Imath_3_2::Vec4<short>,_std::allocator<Imath_3_2::Vec4<short>_>_>::~vector
                ((vector<Imath_3_2::Vec4<short>,_std::allocator<Imath_3_2::Vec4<short>_>_> *)
                 in_stack_fffffffffffffe90);
      Imath_3_2::Rand32::Rand32
                ((Rand32 *)in_stack_fffffffffffffe80,
                 CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      local_c4 = 10;
      Imath_3_2::Box<Imath_3_2::Vec4<short>_>::Box(in_stack_fffffffffffffe80);
      Imath_3_2::Vec4<short>::Vec4(&local_dc);
      Imath_3_2::Vec4<short>::Vec4(&local_e4);
      local_e8 = 1;
      while( true ) {
        if (9 < local_e8) {
          return;
        }
        Imath_3_2::Vec4<short>::Vec4(&local_f0);
        Imath_3_2::Vec4<short>::Vec4(&local_f8);
        for (local_fc = 0; uVar3 = Imath_3_2::Vec4<short>::dimensions(), local_fc < uVar3;
            local_fc = local_fc + 1) {
          fVar9 = Imath_3_2::Rand32::nextf
                            ((Rand32 *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
                             in_stack_fffffffffffffe78);
          in_stack_fffffffffffffea6 = (short)(int)fVar9;
          psVar8 = Imath_3_2::Vec4<short>::operator[](&local_f0,local_fc);
          *psVar8 = in_stack_fffffffffffffea6;
          fVar9 = Imath_3_2::Rand32::nextf
                            ((Rand32 *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
                             in_stack_fffffffffffffe78);
          psVar8 = Imath_3_2::Vec4<short>::operator[](&local_f8,local_fc);
          *psVar8 = (short)(int)fVar9;
        }
        Imath_3_2::Vec4<short>::operator=(&local_dc,&local_d4);
        Imath_3_2::Vec4<short>::operator=(&local_e4,&VStack_cc);
        local_100 = 0;
        while (uVar3 = local_100, uVar4 = Imath_3_2::Vec4<short>::dimensions(), uVar3 < uVar4) {
          in_stack_fffffffffffffe80 =
               (Box<Imath_3_2::Vec4<short>_> *)
               Imath_3_2::Vec4<short>::operator[](&local_dc,local_100);
          psVar8 = Imath_3_2::Vec4<short>::operator[](&local_f0,local_100);
          psVar8 = std::min<short>((short *)in_stack_fffffffffffffe80,psVar8);
          in_stack_fffffffffffffe8e = *psVar8;
          psVar8 = Imath_3_2::Vec4<short>::operator[](&local_dc,local_100);
          *psVar8 = in_stack_fffffffffffffe8e;
          in_stack_fffffffffffffe90 =
               (Box<Imath_3_2::Vec4<short>_> *)
               Imath_3_2::Vec4<short>::operator[](&local_e4,local_100);
          psVar8 = Imath_3_2::Vec4<short>::operator[](&local_f8,local_100);
          psVar8 = std::max<short>((short *)in_stack_fffffffffffffe90,psVar8);
          in_stack_fffffffffffffe9e = *psVar8;
          psVar8 = Imath_3_2::Vec4<short>::operator[](&local_e4,local_100);
          *psVar8 = in_stack_fffffffffffffe9e;
          local_100 = local_100 + 1;
        }
        Imath_3_2::Box<Imath_3_2::Vec4<short>_>::Box
                  (in_stack_fffffffffffffe90,
                   (Vec4<short> *)CONCAT26(in_stack_fffffffffffffe8e,in_stack_fffffffffffffe88),
                   &in_stack_fffffffffffffe80->min);
        Imath_3_2::Box<Imath_3_2::Vec4<short>_>::extendBy
                  ((Box<Imath_3_2::Vec4<short>_> *)
                   CONCAT26(in_stack_fffffffffffffea6,CONCAT24(in_stack_fffffffffffffea4,uVar3)),
                   (Box<Imath_3_2::Vec4<short>_> *)
                   CONCAT26(in_stack_fffffffffffffe9e,in_stack_fffffffffffffe98));
        bVar1 = Imath_3_2::Vec4<short>::operator==(&local_d4,&local_dc);
        in_stack_fffffffffffffe7c = (float)((uint)in_stack_fffffffffffffe7c & 0xffffff);
        if (bVar1) {
          bVar1 = Imath_3_2::Vec4<short>::operator==(&VStack_cc,&local_e4);
          in_stack_fffffffffffffe7c = (float)CONCAT13(bVar1,SUB43(in_stack_fffffffffffffe7c,0));
        }
        if ((char)((uint)in_stack_fffffffffffffe7c >> 0x18) == '\0') break;
        local_e8 = local_e8 + 1;
      }
      __assert_fail("b.min == min && b.max == max",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                    ,0x165,
                    "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec4<short>]"
                   );
    }
    local_64 = 0;
    while( true ) {
      uVar6 = (ulong)local_64;
      sVar7 = std::vector<Imath_3_2::Vec4<short>,_std::allocator<Imath_3_2::Vec4<short>_>_>::size
                        (&local_50);
      if (sVar7 <= uVar6) break;
      std::vector<Imath_3_2::Vec4<short>,_std::allocator<Imath_3_2::Vec4<short>_>_>::operator[]
                (&local_50,(ulong)local_60);
      Imath_3_2::Vec4<short>::operator-
                ((Vec4<short> *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      v = std::vector<Imath_3_2::Vec4<short>,_std::allocator<Imath_3_2::Vec4<short>_>_>::operator[]
                    (&local_50,(ulong)local_64);
      Imath_3_2::Vec4<short>::Vec4(&local_74,v);
      Imath_3_2::Box<Imath_3_2::Vec4<short>_>::Box(in_stack_fffffffffffffe80);
      Imath_3_2::Box<Imath_3_2::Vec4<short>_>::Box
                (in_stack_fffffffffffffe90,
                 (Vec4<short> *)CONCAT26(in_stack_fffffffffffffe8e,in_stack_fffffffffffffe88),
                 &in_stack_fffffffffffffe80->min);
      Imath_3_2::Box<Imath_3_2::Vec4<short>_>::extendBy
                ((Box<Imath_3_2::Vec4<short>_> *)
                 CONCAT26(in_stack_fffffffffffffea6,
                          CONCAT24(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0)),
                 (Box<Imath_3_2::Vec4<short>_> *)
                 CONCAT26(in_stack_fffffffffffffe9e,in_stack_fffffffffffffe98));
      bVar1 = Imath_3_2::Vec4<short>::operator==(&local_84,&local_6c);
      local_141 = false;
      if (bVar1) {
        local_141 = Imath_3_2::Vec4<short>::operator==(&VStack_7c,&local_74);
      }
      if (local_141 == false) {
        __assert_fail("b0.min == p0 && b0.max == p1",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                      ,0x13f,
                      "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec4<short>]"
                     );
      }
      Imath_3_2::Box<Imath_3_2::Vec4<short>_>::Box
                (in_stack_fffffffffffffe90,
                 (Vec4<short> *)CONCAT26(in_stack_fffffffffffffe8e,in_stack_fffffffffffffe88),
                 &in_stack_fffffffffffffe80->min);
      Imath_3_2::Box<Imath_3_2::Vec4<short>_>::Box(in_stack_fffffffffffffe80);
      Imath_3_2::Box<Imath_3_2::Vec4<short>_>::extendBy
                ((Box<Imath_3_2::Vec4<short>_> *)
                 CONCAT26(in_stack_fffffffffffffea6,
                          CONCAT24(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0)),
                 (Box<Imath_3_2::Vec4<short>_> *)
                 CONCAT26(in_stack_fffffffffffffe9e,in_stack_fffffffffffffe98));
      bVar1 = Imath_3_2::Vec4<short>::operator==(&local_a4,&local_6c);
      local_142 = false;
      if (bVar1) {
        local_142 = Imath_3_2::Vec4<short>::operator==(aVStack_9c,&local_74);
      }
      if (local_142 == false) {
        __assert_fail("b1.min == p0 && b1.max == p1",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                      ,0x143,
                      "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec4<short>]"
                     );
      }
      local_64 = local_64 + 1;
    }
    local_60 = local_60 + 1;
  } while( true );
}

Assistant:

void
testExtendByBox (const char* type)
{
    cout << "    extendBy() box for type " << type << endl;

    //
    // Extend empty box with an empty box;
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b;
        b.extendBy (IMATH_INTERNAL_NAMESPACE::Box<T> ());
        assert (
            b.min == T (T::baseTypeMax ()) &&
            b.max == T (T::baseTypeLowest ()));
    }

    //
    // Extend empty box with a non-empty box and vice versa.
    //
    {
        std::vector<T> perms;
        permutations (perms);

        for (unsigned int i = 0; i < perms.size (); i++)
        {
            for (unsigned int j = 0; j < perms.size (); j++)
            {
                T p0 = -perms[i];
                T p1 = perms[j];

                IMATH_INTERNAL_NAMESPACE::Box<T> b0;
                b0.extendBy (IMATH_INTERNAL_NAMESPACE::Box<T> (p0, p1));
                assert (b0.min == p0 && b0.max == p1);

                IMATH_INTERNAL_NAMESPACE::Box<T> b1 (p0, p1);
                b1.extendBy (IMATH_INTERNAL_NAMESPACE::Box<T> ());
                assert (b1.min == p0 && b1.max == p1);
            }
        }
    }

    //
    // Extend non-empty box with non-empty box. Starts with empty, then builds.
    //
    IMATH_INTERNAL_NAMESPACE::Rand32 rand (0);
    const unsigned int               iters = 10;
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b;

        T min, max;

        for (unsigned int i = 1; i < iters; i++)
        {
            T p0;
            T p1;
            for (unsigned int k = 0; k < T::dimensions (); k++)
            {
                p0[k] = typename T::BaseType (rand.nextf (0, 999));
                p1[k] = typename T::BaseType (rand.nextf (1000, 1999));
            }

            min = b.min;
            max = b.max;
            for (unsigned int k = 0; k < T::dimensions (); k++)
            {
                min[k] = std::min (min[k], p0[k]);
                max[k] = std::max (max[k], p1[k]);
            }
            b.extendBy (IMATH_INTERNAL_NAMESPACE::Box<T> (p0, p1));

            assert (b.min == min && b.max == max);
        }
    }
}